

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

_Bool f64_addsub_post(union_float64 a,union_float64 b)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = __fpclassify(a.h);
  _Var2 = true;
  if (iVar1 == 2) {
    iVar1 = __fpclassify(b.h);
    _Var2 = iVar1 != 2;
  }
  return _Var2;
}

Assistant:

static bool f64_addsub_post(union_float64 a, union_float64 b)
{
    if (QEMU_HARDFLOAT_2F64_USE_FP) {
        return !(fpclassify(a.h) == FP_ZERO && fpclassify(b.h) == FP_ZERO);
    } else {
        return !(float64_is_zero(a.s) && float64_is_zero(b.s));
    }
}